

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionScreen::Drawer(DIntermissionScreen *this)

{
  double x;
  DFrameBuffer *pDVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  FIIntermissionPatch *pFVar5;
  FTexture *pFVar6;
  uint local_1c;
  uint i;
  DIntermissionScreen *this_local;
  
  bVar2 = FTextureID::isValid(&this->mBackground);
  pDVar1 = screen;
  if (bVar2) {
    if ((this->mFlatfill & 1U) == 0) {
      pFVar6 = FTextureManager::operator[](&TexMan,(FTextureID)(this->mBackground).texnum);
      DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar6,0.0,0.0,0x400013ae,1,0);
    }
    else {
      uVar3 = DCanvas::GetWidth((DCanvas *)screen);
      uVar4 = DCanvas::GetHeight((DCanvas *)screen);
      pFVar6 = FTextureManager::operator[](&TexMan,(FTextureID)(this->mBackground).texnum);
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
                (pDVar1,0,0,(ulong)uVar3,(ulong)uVar4,pFVar6,0);
    }
  }
  else {
    uVar3 = DCanvas::GetWidth((DCanvas *)screen);
    uVar4 = DCanvas::GetHeight((DCanvas *)screen);
    (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (pDVar1,0,0,(ulong)uVar3,(ulong)uVar4,0,0);
  }
  for (local_1c = 0;
      uVar3 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::Size(&this->mOverlays),
      local_1c < uVar3; local_1c = local_1c + 1) {
    bVar2 = CheckOverlay(this,local_1c);
    pDVar1 = screen;
    if (bVar2) {
      pFVar5 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                         (&this->mOverlays,(ulong)local_1c);
      pFVar6 = FTextureManager::operator[](&TexMan,(FTextureID)(pFVar5->mPic).texnum);
      pFVar5 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                         (&this->mOverlays,(ulong)local_1c);
      x = pFVar5->x;
      pFVar5 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                         (&this->mOverlays,(ulong)local_1c);
      DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar6,x,pFVar5->y,0x40001391,1,0);
    }
  }
  if ((this->mFlatfill & 1U) == 0) {
    DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
  }
  return;
}

Assistant:

void DIntermissionScreen::Drawer ()
{
	if (mBackground.isValid())
	{
		if (!mFlatfill)
		{
			screen->DrawTexture (TexMan[mBackground], 0, 0, DTA_Fullscreen, true, TAG_DONE);
		}
		else
		{
			screen->FlatFill (0,0, SCREENWIDTH, SCREENHEIGHT, TexMan[mBackground]);
		}
	}
	else
	{
		screen->Clear (0, 0, SCREENWIDTH, SCREENHEIGHT, 0, 0);
	}
	for (unsigned i=0; i < mOverlays.Size(); i++)
	{
		if (CheckOverlay(i))
			screen->DrawTexture (TexMan[mOverlays[i].mPic], mOverlays[i].x, mOverlays[i].y, DTA_320x200, true, TAG_DONE);
	}
	if (!mFlatfill) screen->FillBorder (NULL);
}